

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int searchvar(FuncState *fs,TString *n,expdesc *var)

{
  Vardesc *pVVar1;
  Vardesc *vd;
  int i;
  expdesc *var_local;
  TString *n_local;
  FuncState *fs_local;
  
  vd._4_4_ = (uint)fs->nactvar;
  do {
    vd._4_4_ = vd._4_4_ - 1;
    if ((int)vd._4_4_ < 0) {
      return -1;
    }
    pVVar1 = getlocalvardesc(fs,vd._4_4_);
  } while (n != (pVVar1->vd).name);
  if ((pVVar1->vd).kind == '\x03') {
    init_exp(var,VCONST,fs->firstlocal + vd._4_4_);
  }
  else {
    init_var(fs,var,vd._4_4_);
  }
  return var->k;
}

Assistant:

static int searchvar (FuncState *fs, TString *n, expdesc *var) {
  int i;
  for (i = cast_int(fs->nactvar) - 1; i >= 0; i--) {
    Vardesc *vd = getlocalvardesc(fs, i);
    if (eqstr(n, vd->vd.name)) {  /* found? */
      if (vd->vd.kind == RDKCTC)  /* compile-time constant? */
        init_exp(var, VCONST, fs->firstlocal + i);
      else  /* real variable */
        init_var(fs, var, i);
      return cast_int(var->k);
    }
  }
  return -1;  /* not found */
}